

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O1

int ARKBandPrecFree(ARKodeMem ark_mem)

{
  void *pvVar1;
  
  if (((ark_mem != (ARKodeMem)0x0) &&
      (pvVar1 = (*ark_mem->step_getlinmem)(ark_mem), pvVar1 != (void *)0x0)) &&
     (pvVar1 = *(void **)((long)pvVar1 + 0xe8), pvVar1 != (void *)0x0)) {
    SUNLinSolFree(*(undefined8 *)((long)pvVar1 + 0x28));
    SUNMatDestroy(*(undefined8 *)((long)pvVar1 + 0x20));
    SUNMatDestroy(*(undefined8 *)((long)pvVar1 + 0x18));
    arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x30));
    arkFreeVec(ark_mem,(N_Vector *)((long)pvVar1 + 0x38));
    free(pvVar1);
  }
  return 0;
}

Assistant:

static int ARKBandPrecFree(ARKodeMem ark_mem)
{
  ARKLsMem arkls_mem;
  void* ark_step_lmem;
  ARKBandPrecData pdata;

  /* Return immediately if ARKodeMem, ARKLsMem or ARKBandPrecData are NULL */
  if (ark_mem == NULL) { return (0); }
  ark_step_lmem = ark_mem->step_getlinmem((void*)ark_mem);
  if (ark_step_lmem == NULL) { return (0); }
  arkls_mem = (ARKLsMem)ark_step_lmem;
  if (arkls_mem->P_data == NULL) { return (0); }
  pdata = (ARKBandPrecData)arkls_mem->P_data;

  SUNLinSolFree(pdata->LS);
  SUNMatDestroy(pdata->savedP);
  SUNMatDestroy(pdata->savedJ);
  arkFreeVec(ark_mem, &(pdata->tmp1));
  arkFreeVec(ark_mem, &(pdata->tmp2));

  free(pdata);
  pdata = NULL;

  return (0);
}